

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

int hex_digit_to_int(uchar ch)

{
  int local_c;
  uchar ch_local;
  
  if ((ch < 0x30) || (0x39 < ch)) {
    if ((ch < 0x61) || (0x66 < ch)) {
      if ((ch < 0x41) || (0x46 < ch)) {
        __assert_fail("(\"unknown error\", false)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/./././util/util.hpp"
                      ,0x1c,"int hex_digit_to_int(unsigned char)");
      }
      local_c = ch - 0x37;
    }
    else {
      local_c = ch - 0x57;
    }
  }
  else {
    local_c = ch - 0x30;
  }
  return local_c;
}

Assistant:

inline int hex_digit_to_int(unsigned char ch) {
    if ('0' <= ch && ch <= '9') {
        return ch - '0';
    }
    if ('a' <= ch && ch <= 'f') {
        return ch - 'a' + 10;
    }
    if ('A' <= ch && ch <= 'F') {
        return ch - 'A' + 10;
    }
    assert(("unknown error", false));
    return -1;
}